

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O3

int add_attribute_octet(stack_st_X509_ATTRIBUTE *attrs,int nid,uchar *buffer,int len)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint len_00;
  char *pcVar4;
  ASN1_STRING *str;
  X509_ATTRIBUTE *pXVar5;
  BIO_METHOD *pBVar6;
  BIO *pBVar7;
  PKCS7 *pPVar8;
  char **b;
  stack_st_PKCS7_SIGNER_INFO *psVar9;
  FILE *pFVar10;
  FILE *pFVar11;
  X509_STORE *ctx;
  X509_STORE_CTX *ctx_00;
  FILE *pFVar12;
  FILE *b_00;
  size_t __n;
  X509 **ppXVar13;
  ulong uVar14;
  void *__src;
  char *pcVar15;
  ASN1_OBJECT *a;
  ASN1_TYPE *pAVar16;
  X509_CRL *x;
  X509 *pXVar17;
  X509_NAME *pXVar18;
  X509_NAME *b_01;
  FILE *pFVar19;
  ASN1_INTEGER *x_00;
  X509_EXTENSION *pXVar20;
  ulong uVar21;
  int *piVar22;
  EVP_PKEY **buffer_00;
  ulong uVar23;
  uint extraout_EDX;
  FILE *extraout_RDX;
  undefined8 uVar24;
  FILE *pFVar25;
  ASN1_STRING *pAVar26;
  char *pcVar27;
  int *piVar28;
  long lVar29;
  X509 *pXVar30;
  char **__size;
  uint uStack_2624;
  PKCS7 *pPStack_2620;
  BIO *pBStack_2618;
  long lStack_2610;
  byte abStack_2608 [64];
  char acStack_25c8 [1024];
  char acStack_21c8 [1032];
  FILE *pFStack_1dc0;
  int *piStack_1db8;
  X509 *pXStack_1db0;
  FILE *pFStack_1da8;
  char **ppcStack_1da0;
  FILE *pFStack_1d98;
  int aiStack_1d90 [258];
  FILE *pFStack_1988;
  int *piStack_1980;
  X509 *pXStack_1978;
  X509_CRL *pXStack_1970;
  FILE *pFStack_1968;
  FILE *pFStack_1960;
  FILE aFStack_1958 [4];
  FILE aFStack_1558 [4];
  char acStack_1158 [2056];
  FILE *pFStack_950;
  FILE *pFStack_948;
  FILE *pFStack_940;
  X509_CRL *pXStack_938;
  FILE *pFStack_930;
  FILE *pFStack_928;
  X509_CRL *pXStack_918;
  FILE *pFStack_910;
  FILE *pFStack_908;
  FILE *pFStack_900;
  X509_CRL *pXStack_8f8;
  FILE *pFStack_8f0;
  code *pcStack_8e8;
  X509_CRL *pXStack_8d8;
  FILE *pFStack_8d0;
  FILE *pFStack_8c8;
  FILE *pFStack_8c0;
  FILE *pFStack_8b8;
  FILE *pFStack_8b0;
  undefined1 auStack_8a0 [1040];
  ASN1_STRING *pAStack_490;
  FILE *pFStack_488;
  X509_STORE *pXStack_480;
  X509_STORE_CTX *pXStack_478;
  FILE *pFStack_470;
  FILE *pFStack_468;
  undefined1 auStack_460 [1032];
  stack_st_X509_ATTRIBUTE *psStack_58;
  ASN1_STRING *pAStack_50;
  
  pcVar27 = pname;
  if (d_flag != 0) {
    pcVar4 = OBJ_nid2sn(nid);
    printf("%s: adding octet attribute %s\n",pcVar27,pcVar4);
  }
  str = ASN1_STRING_new();
  pAVar26 = str;
  iVar2 = ASN1_STRING_set(str,buffer,len);
  if (0 < iVar2) {
    pXVar5 = X509_ATTRIBUTE_create(nid,4,str);
    OPENSSL_sk_push(attrs,pXVar5);
    return 0;
  }
  add_attribute_octet_cold_1();
  pFStack_468 = (FILE *)0x10cb97;
  psStack_58 = attrs;
  pAStack_50 = str;
  pBVar6 = BIO_s_mem();
  pFStack_468 = (FILE *)0x10cb9f;
  pBVar7 = BIO_new(pBVar6);
  if (v_flag != 0) {
    pFStack_468 = (FILE *)0x10cbc6;
    printf("%s: reading outer PKCS#7\n",pname);
  }
  pFStack_468 = (FILE *)0x10cbdb;
  uVar3 = BIO_write(pBVar7,*(void **)(pAVar26 + 8),*(int *)&pAVar26[8].data);
  if ((int)uVar3 < 1) {
    pFStack_468 = (FILE *)0x10cf65;
    pkcs7_verify_unwrap_cold_12();
LAB_0010cf65:
    pFStack_468 = (FILE *)0x10cf6a;
    pkcs7_verify_unwrap_cold_11();
LAB_0010cf6a:
    pFStack_468 = (FILE *)0x10cf6f;
    pkcs7_verify_unwrap_cold_1();
LAB_0010cf6f:
    pFStack_468 = (FILE *)0x10cf74;
    pkcs7_verify_unwrap_cold_10();
  }
  else {
    if (v_flag != 0) {
      pFStack_468 = (FILE *)0x10cc09;
      printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
    }
    pFStack_468 = (FILE *)0x10cc16;
    BIO_set_flags(pBVar7,0x200);
    pFStack_468 = (FILE *)0x10cc20;
    pPVar8 = d2i_PKCS7_bio(pBVar7,(PKCS7 **)0x0);
    pAVar26[7].flags = (long)pPVar8;
    if (pPVar8 == (PKCS7 *)0x0) goto LAB_0010cf65;
    if (d_flag != 0) {
      pFStack_468 = (FILE *)0x10cc54;
      printf("%s: printing PEM fomatted PKCS#7\n",pname);
      pFStack_468 = (FILE *)0x10cc6a;
      PEM_write_PKCS7(_stdout,(PKCS7 *)pAVar26[7].flags);
      pPVar8 = (PKCS7 *)pAVar26[7].flags;
    }
    pFStack_468 = (FILE *)0x10cc7a;
    iVar2 = OBJ_obj2nid(pPVar8->type);
    if (iVar2 != 0x16) goto LAB_0010cf6a;
    pFStack_468 = (FILE *)0x10cc91;
    pBVar7 = PKCS7_dataInit((PKCS7 *)pAVar26[7].flags,(BIO *)0x0);
    if (pBVar7 == (BIO *)0x0) goto LAB_0010cf6f;
    pFStack_468 = (FILE *)0x10cca2;
    pBVar6 = BIO_s_mem();
    pFStack_468 = (FILE *)0x10ccaa;
    b = (char **)BIO_new(pBVar6);
    pFStack_468 = (FILE *)0x10ccbd;
    uVar3 = BIO_read(pBVar7,auStack_460,0x400);
    len_00 = uVar3;
    while (0 < (int)len_00) {
      pFStack_468 = (FILE *)0x10ccd5;
      BIO_write((BIO *)b,auStack_460,len_00);
      pFStack_468 = (FILE *)0x10cce5;
      len_00 = BIO_read(pBVar7,auStack_460,0x400);
      uVar3 = uVar3 + len_00;
    }
    pFStack_468 = (FILE *)0x10ccfc;
    BIO_ctrl((BIO *)b,0xb,0,(void *)0x0);
    if (v_flag != 0) {
      pFStack_468 = (FILE *)0x10cd22;
      printf("%s: PKCS#7 contains %d bytes of signed data\n",pname,(ulong)uVar3);
    }
    pFStack_468 = (FILE *)0x10cd2e;
    psVar9 = PKCS7_get_signer_info((PKCS7 *)pAVar26[7].flags);
    if (psVar9 != (stack_st_PKCS7_SIGNER_INFO *)0x0) {
      if (v_flag != 0) {
        pFStack_468 = (FILE *)0x10cd5e;
        printf("%s: verifying signature\n",pname);
      }
      pFStack_468 = (FILE *)0x10cd68;
      pFVar10 = (FILE *)OPENSSL_sk_value(psVar9,0);
      pFStack_468 = (FILE *)0x10cd7a;
      pFVar11 = (FILE *)PKCS7_cert_from_signer_info
                                  ((PKCS7 *)pAVar26[7].flags,(PKCS7_SIGNER_INFO *)pFVar10);
      if (pFVar11 == (FILE *)0x0) {
        pFStack_468 = (FILE *)0x10cd9a;
        printf("%s: Can\'t read signer cert from pkcs7\n",pname);
      }
      pFStack_468 = (FILE *)0x10cdaf;
      iVar2 = PKCS7_signatureVerify
                        (pBVar7,(PKCS7 *)pAVar26[7].flags,(PKCS7_SIGNER_INFO *)pFVar10,
                         (X509 *)pFVar11);
      if (iVar2 < 1) goto LAB_0010cf79;
      if (v_flag != 0) {
        pFStack_468 = (FILE *)0x10cddb;
        printf("%s: signature ok\n");
      }
      pFStack_468 = (FILE *)0x10cde0;
      ctx = X509_STORE_new();
      if (ctx == (X509_STORE *)0x0) {
        pFStack_468 = (FILE *)0x10cf3d;
        pkcs7_verify_unwrap_cold_2();
      }
      pFStack_468 = (FILE *)0x10cdf6;
      X509_STORE_set_flags(ctx,0);
      pFStack_468 = (FILE *)0x10ce03;
      X509_STORE_load_locations(ctx,(char *)buffer,(char *)0x0);
      pFStack_468 = (FILE *)0x10ce08;
      ctx_00 = X509_STORE_CTX_new();
      if (ctx_00 == (X509_STORE_CTX *)0x0) {
        pFStack_468 = (FILE *)0x10cf47;
        pkcs7_verify_unwrap_cold_3();
      }
      buffer_00 = (EVP_PKEY **)0x0;
      pFStack_468 = (FILE *)0x10ce24;
      iVar2 = X509_STORE_CTX_init(ctx_00,ctx,(X509 *)pFVar11,(stack_st_X509 *)0x0);
      if (iVar2 == 0) {
        pFStack_468 = (FILE *)0x10cf51;
        pkcs7_verify_unwrap_cold_4();
      }
      pFStack_468 = (FILE *)0x10ce34;
      iVar2 = X509_verify_cert(ctx_00);
      if (iVar2 == 0) {
        pFStack_468 = (FILE *)0x10cf5b;
        pkcs7_verify_unwrap_cold_5();
      }
      pFVar12 = pFVar10;
      if (w_flag == 0) {
LAB_0010cefa:
        pFStack_468 = (FILE *)0x10cf04;
        pFVar19 = (FILE *)b;
        pPVar8 = d2i_PKCS7_bio((BIO *)b,(PKCS7 **)0x0);
        pAVar26[7].flags = (long)pPVar8;
        if (pPVar8 != (PKCS7 *)0x0) {
          pFStack_468 = (FILE *)0x10cf1c;
          X509_STORE_free(ctx);
          pFStack_468 = (FILE *)0x10cf24;
          X509_STORE_CTX_cleanup(ctx_00);
          return 0;
        }
        pFStack_468 = (FILE *)0x10cfaf;
        pkcs7_verify_unwrap_cold_8();
        pFVar10 = pFVar12;
LAB_0010cfaf:
        pFVar12 = pFVar10;
        pFStack_468 = (FILE *)0x10cfb4;
        pkcs7_verify_unwrap_cold_7();
      }
      else {
        pFStack_468 = (FILE *)0x10ce62;
        pFVar19 = (FILE *)w_char;
        pFVar12 = fopen(w_char,"w");
        if (pFVar12 == (FILE *)0x0) goto LAB_0010cfaf;
        if (v_flag != 0) {
          pFStack_468 = (FILE *)0x10ce92;
          printf("%s: writing cert\n",w_char);
        }
        if (d_flag != 0) {
          pFStack_468 = (FILE *)0x10ceb0;
          PEM_write_X509(_stdout,(X509 *)pFVar11);
        }
        pFStack_468 = (FILE *)0x10cebb;
        pFVar19 = pFVar12;
        iVar2 = PEM_write_X509(pFVar12,(X509 *)pFVar11);
        if (iVar2 == 1) {
          if (v_flag != 0) {
            pFStack_468 = (FILE *)0x10cef2;
            printf("%s: certificate written as %s\n",pname,w_char);
          }
          pFStack_468 = (FILE *)0x10cefa;
          fclose(pFVar12);
          goto LAB_0010cefa;
        }
      }
      pFStack_468 = (FILE *)pkcs7_unwrap;
      pkcs7_verify_unwrap_cold_6();
      pFStack_8b0 = (FILE *)0x10cfd2;
      pAStack_490 = pAVar26;
      pFStack_488 = pFVar11;
      pXStack_480 = ctx;
      pXStack_478 = ctx_00;
      pFStack_470 = (FILE *)b;
      pFStack_468 = pFVar12;
      pBVar6 = BIO_s_mem();
      pFStack_8b0 = (FILE *)0x10cfda;
      pFVar10 = (FILE *)BIO_new(pBVar6);
      piVar28 = &v_flag;
      if (v_flag != 0) {
        pFStack_8b0 = (FILE *)0x10d003;
        printf("%s: reading outer PKCS#7\n",pname);
      }
      pFVar25 = *(FILE **)&pFVar19->_mode;
      pFStack_8b0 = (FILE *)0x10d018;
      pcVar27 = (char *)pFVar10;
      uVar3 = BIO_write((BIO *)pFVar10,pFVar25,*(int *)(pFVar19->_unused2 + 4));
      if ((int)uVar3 < 1) {
        pFStack_8b0 = (FILE *)0x10d6bd;
        pkcs7_unwrap_cold_20();
LAB_0010d6bd:
        pFStack_8b0 = (FILE *)0x10d6c2;
        pkcs7_unwrap_cold_1();
LAB_0010d6c2:
        pFStack_8b0 = (FILE *)0x10d6c7;
        pkcs7_unwrap_cold_19();
LAB_0010d6c7:
        pFStack_8b0 = (FILE *)0x10d6cc;
        pkcs7_unwrap_cold_18();
LAB_0010d6cc:
        pFStack_8b0 = (FILE *)0x10d6d1;
        pkcs7_unwrap_cold_17();
LAB_0010d6d1:
        pFStack_8b0 = (FILE *)0x10d6d6;
        pkcs7_unwrap_cold_16();
LAB_0010d6d6:
        pcVar4 = (char *)pFVar11;
        pFStack_8b0 = (FILE *)0x10d6db;
        pkcs7_unwrap_cold_2();
LAB_0010d6db:
        pFStack_8b0 = (FILE *)0x10d6e0;
        pkcs7_unwrap_cold_3();
LAB_0010d6e0:
        pFStack_8b0 = (FILE *)0x10d6e5;
        pkcs7_unwrap_cold_4();
LAB_0010d6e5:
        pFStack_8b0 = (FILE *)0x10d6ea;
        pkcs7_unwrap_cold_5();
LAB_0010d6ea:
        pFStack_8b0 = (FILE *)0x10d6ef;
        pkcs7_unwrap_cold_6();
LAB_0010d6ef:
        pFStack_8b0 = (FILE *)0x10d6f4;
        pkcs7_unwrap_cold_8();
LAB_0010d6f4:
        pFStack_8b0 = (FILE *)0x10d6f9;
        pkcs7_unwrap_cold_14();
LAB_0010d6f9:
        pFVar11 = pFVar12;
        pFStack_8b0 = (FILE *)0x10d6fe;
        pkcs7_unwrap_cold_13();
LAB_0010d6fe:
        pFStack_8b0 = (FILE *)0x10d703;
        pkcs7_unwrap_cold_12();
LAB_0010d703:
        pFStack_8b0 = (FILE *)0x10d708;
        pkcs7_unwrap_cold_15();
        pFVar12 = pFVar11;
LAB_0010d708:
        pFStack_8b0 = (FILE *)0x10d70d;
        pkcs7_unwrap_cold_9();
        auStack_8a0._0_8_ = pcVar27;
      }
      else {
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d041;
          printf("%s: PKCS#7 payload size: %d bytes\n",pname,(ulong)uVar3);
        }
        pFStack_8b0 = (FILE *)0x10d04e;
        BIO_set_flags((BIO *)pFVar10,0x200);
        pFVar25 = (FILE *)0x0;
        pFStack_8b0 = (FILE *)0x10d058;
        pPVar8 = d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
        pFVar19->__pad5 = (size_t)pPVar8;
        piVar22 = &d_flag;
        buffer_00 = (EVP_PKEY **)piVar22;
        if (d_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d083;
          printf("%s: printing PEM fomatted PKCS#7\n",pname);
          pFVar25 = (FILE *)pFVar19->__pad5;
          pFStack_8b0 = (FILE *)0x10d099;
          PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar25);
          pPVar8 = (PKCS7 *)pFVar19->__pad5;
          buffer_00 = (EVP_PKEY **)piVar22;
        }
        pcVar27 = (char *)pPVar8->type;
        pFStack_8b0 = (FILE *)0x10d0a9;
        iVar2 = OBJ_obj2nid((ASN1_OBJECT *)pcVar27);
        if (iVar2 != 0x16) goto LAB_0010d6bd;
        pcVar27 = (char *)pFVar19->__pad5;
        pFVar25 = (FILE *)0x0;
        pFStack_8b0 = (FILE *)0x10d0c0;
        b_00 = (FILE *)PKCS7_dataInit((PKCS7 *)pcVar27,(BIO *)0x0);
        if (b_00 == (FILE *)0x0) goto LAB_0010d6c2;
        pFStack_8b0 = (FILE *)0x10d0d1;
        pBVar6 = BIO_s_mem();
        pFStack_8b0 = (FILE *)0x10d0d9;
        pFVar10 = (FILE *)BIO_new(pBVar6);
        pFStack_8b0 = (FILE *)0x10d0ee;
        uVar3 = BIO_read((BIO *)b_00,auStack_8a0 + 8,0x400);
        pFVar25 = (FILE *)(ulong)uVar3;
        pFVar12 = pFVar25;
        if (0 < (int)uVar3) {
          pFVar11 = (FILE *)(auStack_8a0 + 8);
          do {
            pFStack_8b0 = (FILE *)0x10d108;
            BIO_write((BIO *)pFVar10,pFVar11,(int)pFVar25);
            pFStack_8b0 = (FILE *)0x10d118;
            uVar3 = BIO_read((BIO *)b_00,pFVar11,0x400);
            pFVar25 = (FILE *)(ulong)uVar3;
            pFVar12 = (FILE *)(ulong)((int)pFVar12 + uVar3);
          } while (0 < (int)uVar3);
        }
        pFVar25 = (FILE *)0xb;
        buffer_00 = (EVP_PKEY **)0x0;
        pFStack_8b0 = (FILE *)0x10d12f;
        BIO_ctrl((BIO *)pFVar10,0xb,0,(void *)0x0);
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d150;
          pFVar25 = (FILE *)pname;
          printf("%s: PKCS#7 contains %d bytes of enveloped data\n",pname,pFVar12);
        }
        pcVar27 = (char *)pFVar19->__pad5;
        pFStack_8b0 = (FILE *)0x10d15c;
        psVar9 = PKCS7_get_signer_info((PKCS7 *)pcVar27);
        b = (char **)b_00;
        if (psVar9 == (stack_st_PKCS7_SIGNER_INFO *)0x0) goto LAB_0010d6c7;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d187;
          printf("%s: verifying signature\n",pname);
        }
        pFStack_8b0 = (FILE *)0x10d191;
        pFVar11 = (FILE *)OPENSSL_sk_value(psVar9,0);
        pFVar25 = (FILE *)pFVar19->__pad5;
        pFStack_8b0 = (FILE *)0x10d1b0;
        buffer_00 = (EVP_PKEY **)cacert;
        pcVar27 = (char *)b_00;
        iVar2 = PKCS7_signatureVerify
                          ((BIO *)b_00,(PKCS7 *)pFVar25,(PKCS7_SIGNER_INFO *)pFVar11,(X509 *)cacert)
        ;
        if (iVar2 < 1) goto LAB_0010d6cc;
        if (v_flag != 0) {
          pcVar27 = "%s: signature ok\n";
          pFStack_8b0 = (FILE *)0x10d1d7;
          pFVar25 = (FILE *)pname;
          printf("%s: signature ok\n");
        }
        if (d_flag != 0) {
          pcVar27 = "%s: finding signed attributes\n";
          pFStack_8b0 = (FILE *)0x10d1fb;
          pFVar25 = (FILE *)pname;
          printf("%s: finding signed attributes\n");
        }
        b = (char **)pFVar11->_IO_read_base;
        if ((FILE *)b == (FILE *)0x0) goto LAB_0010d6d1;
        pFVar25 = (FILE *)(ulong)(uint)nid_transId;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d224;
        pcVar27 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_transId,0x13,(char **)buffer_00);
        pcVar4 = (char *)auStack_8a0._0_8_;
        if (iVar2 != 0) goto LAB_0010d6d6;
        pFStack_8b0 = (FILE *)0x10d24c;
        printf("%s: reply transaction id: %s\n",pname,auStack_8a0._0_8_);
        piVar28 = (int *)pFVar19->_IO_buf_end;
        pFStack_8b0 = (FILE *)0x10d258;
        __n = strlen(pcVar4);
        pFStack_8b0 = (FILE *)0x10d266;
        pFVar25 = (FILE *)pcVar4;
        pcVar27 = (char *)piVar28;
        iVar2 = strncmp((char *)piVar28,pcVar4,__n);
        if (iVar2 != 0) goto LAB_0010d6db;
        pFVar25 = (FILE *)(ulong)(uint)nid_messageType;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d289;
        pcVar27 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_messageType,0x13,(char **)buffer_00);
        piVar28 = &v_flag;
        if (iVar2 != 0) goto LAB_0010d6e0;
        pFStack_8b0 = (FILE *)0x10d2a2;
        pcVar27 = (char *)auStack_8a0._0_8_;
        iVar2 = atoi((char *)auStack_8a0._0_8_);
        if (iVar2 != 3) goto LAB_0010d6e5;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d2ca;
          printf("%s: reply message type is good\n",pname);
        }
        pFStack_8b0 = (FILE *)0x10d2e5;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_senderNonce,4,(char **)auStack_8a0);
        if (v_flag != 0 && iVar2 != 0) {
          pFStack_8b0 = (FILE *)0x10d6a5;
          fprintf(_stderr,"%s: cannot find senderNonce\n",pname);
        }
        iVar2 = v_flag;
        pFVar19->_markers = (_IO_marker *)auStack_8a0._0_8_;
        if (iVar2 != 0) {
          pFStack_8b0 = (FILE *)0x10d323;
          printf("%s: senderNonce in reply: ",pname);
          pcVar4 = "%02X";
          lVar29 = 0;
          do {
            pFStack_8b0 = (FILE *)0x10d340;
            printf("%02X",(ulong)*(byte *)((long)&pFVar19->_markers->_next + lVar29));
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x10);
          pFStack_8b0 = (FILE *)0x10d353;
          putchar(10);
        }
        piVar28 = &v_flag;
        pFVar25 = (FILE *)(ulong)(uint)nid_recipientNonce;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d375;
        pcVar27 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_recipientNonce,4,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d6ea;
        pFVar19->_IO_save_end = (char *)auStack_8a0._0_8_;
        pFVar11 = (FILE *)auStack_8a0._0_8_;
        if (v_flag != 0) {
          pFStack_8b0 = (FILE *)0x10d3a5;
          printf("%s: recipientNonce in reply: ",pname);
          lVar29 = 0;
          do {
            pFStack_8b0 = (FILE *)0x10d3c2;
            printf("%02X",(ulong)(byte)pFVar19->_IO_save_end[lVar29]);
            lVar29 = lVar29 + 1;
          } while (lVar29 != 0x10);
          pFStack_8b0 = (FILE *)0x10d3d5;
          putchar(10);
          pFVar11 = (FILE *)pFVar19->_IO_save_end;
        }
        piVar28 = &v_flag;
        pcVar4 = (char *)&pFVar19->_mode;
        lVar29 = 0;
        do {
          if (pFVar19->_IO_save_base[lVar29] != *(char *)((long)&pFVar11->_flags + lVar29)) {
            if (v_flag != 0) {
              pFStack_8b0 = (FILE *)0x10d6b3;
              pkcs7_unwrap_cold_7();
            }
            break;
          }
          lVar29 = lVar29 + 1;
        } while (lVar29 != 0x10);
        pFVar25 = (FILE *)(ulong)(uint)nid_pkiStatus;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d428;
        pcVar27 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_pkiStatus,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d6ef;
        pFStack_8b0 = (FILE *)0x10d43a;
        pcVar27 = (char *)auStack_8a0._0_8_;
        iVar2 = atoi((char *)auStack_8a0._0_8_);
        if (iVar2 == 3) {
          pFStack_8b0 = (FILE *)0x10d534;
          printf("%s: pkistatus: PENDING\n",pname);
          *(undefined4 *)&pFVar19->_IO_write_base = 3;
LAB_0010d53b:
          if (v_flag == 0) {
            return 0;
          }
          if ((int)pFVar12 == 0) {
            return 0;
          }
          pFStack_8b0 = (FILE *)0x10d553;
          pkcs7_unwrap_cold_11();
          return 0;
        }
        if (iVar2 != 2) {
          pFVar11 = pFVar12;
          if (iVar2 == 0) {
            pcVar27 = "%s: pkistatus: SUCCESS\n";
            pFStack_8b0 = (FILE *)0x10d468;
            pFVar25 = (FILE *)pname;
            printf("%s: pkistatus: SUCCESS\n");
            *(undefined4 *)&pFVar19->_IO_write_base = 0;
LAB_0010d4fa:
            if ((int)pFVar12 == 0) goto LAB_0010d6f4;
            if (pFVar19->_flags - 0x13U < 2) {
              ppXVar13 = (X509 **)&pFVar19->_fileno;
              buffer_00 = (EVP_PKEY **)&pFVar19->_old_offset;
            }
            else {
              ppXVar13 = &localcert;
              buffer_00 = &rsa;
            }
            b = (char **)*buffer_00;
            piVar28 = (int *)*ppXVar13;
            pFVar25 = (FILE *)0x0;
            pFStack_8b0 = (FILE *)0x10d570;
            pcVar27 = (char *)pFVar10;
            pFVar11 = (FILE *)d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
            if (pFVar11 == (FILE *)0x0) goto LAB_0010d6f9;
            if (d_flag != 0) {
              pFStack_8b0 = (FILE *)0x10d5a0;
              printf("%s: printing PEM fomatted PKCS#7\n",pname);
              pFStack_8b0 = (FILE *)0x10d5b2;
              PEM_write_PKCS7(_stdout,(PKCS7 *)pFVar11);
            }
            pFStack_8b0 = (FILE *)0x10d5b7;
            pBVar6 = BIO_s_mem();
            pFStack_8b0 = (FILE *)0x10d5bf;
            pFVar10 = (FILE *)BIO_new(pBVar6);
            if (d_flag != 0) {
              pFStack_8b0 = (FILE *)0x10d5e6;
              printf("%s: decrypting inner PKCS#7\n",pname);
            }
            pFStack_8b0 = (FILE *)0x10d5fa;
            buffer_00 = (EVP_PKEY **)pFVar10;
            pFVar25 = (FILE *)b;
            pcVar27 = (char *)pFVar11;
            iVar2 = PKCS7_decrypt((PKCS7 *)pFVar11,(EVP_PKEY *)b,(X509 *)piVar28,(BIO *)pFVar10,0);
            if (iVar2 != 0) {
              pFStack_8b0 = (FILE *)0x10d613;
              BIO_ctrl((BIO *)pFVar10,0xb,0,(void *)0x0);
              pFStack_8b0 = (FILE *)0x10d625;
              uVar14 = BIO_ctrl((BIO *)pFVar10,3,0,pcVar4);
              *(int *)(pFVar19->_unused2 + 4) = (int)uVar14;
              if (v_flag != 0) {
                pFStack_8b0 = (FILE *)0x10d651;
                printf("%s: PKCS#7 payload size: %d bytes\n",pname,uVar14 & 0xffffffff);
              }
              pFStack_8b0 = (FILE *)0x10d65e;
              BIO_set_flags((BIO *)pFVar10,0x200);
              pFStack_8b0 = (FILE *)0x10d668;
              pPVar8 = d2i_PKCS7_bio((BIO *)pFVar10,(PKCS7 **)0x0);
              pFVar19->__pad5 = (size_t)pPVar8;
              return 0;
            }
            goto LAB_0010d6fe;
          }
          goto LAB_0010d703;
        }
        pFStack_8b0 = (FILE *)0x10d48c;
        printf("%s: pkistatus: FAILURE\n",pname);
        *(undefined4 *)&pFVar19->_IO_write_base = 2;
        pFVar25 = (FILE *)(ulong)(uint)nid_failInfo;
        buffer_00 = (EVP_PKEY **)auStack_8a0;
        pFStack_8b0 = (FILE *)0x10d4ae;
        pcVar27 = (char *)b;
        iVar2 = get_signed_attribute
                          ((stack_st_X509_ATTRIBUTE *)b,nid_failInfo,0x13,(char **)buffer_00);
        if (iVar2 != 0) goto LAB_0010d708;
        pFStack_8b0 = (FILE *)0x10d4c0;
        uVar3 = atoi((char *)auStack_8a0._0_8_);
        if (uVar3 < 5) {
          buffer_00 = (EVP_PKEY **)(ulong)uVar3;
          iVar2 = *(int *)(&DAT_00111428 + (long)buffer_00 * 4);
          *(uint *)&pFVar19->_IO_write_end = uVar3;
          pcVar27 = "%s: reason: %s\n";
          pFStack_8b0 = (FILE *)0x10d4f4;
          pFVar25 = (FILE *)pname;
          printf("%s: reason: %s\n",pname,&DAT_00111428 + iVar2);
          if (*(int *)&pFVar19->_IO_write_base != 0) goto LAB_0010d53b;
          goto LAB_0010d4fa;
        }
      }
      pFStack_8b0 = (FILE *)get_signed_attribute;
      pkcs7_unwrap_cold_10();
      pcStack_8e8 = (code *)0x10d72d;
      pFStack_8d0 = pFVar19;
      pFStack_8c8 = (FILE *)pcVar4;
      pFStack_8c0 = pFVar10;
      pFStack_8b8 = (FILE *)b;
      pFStack_8b0 = pFVar12;
      iVar2 = get_attribute((stack_st_X509_ATTRIBUTE *)auStack_8a0._0_8_,(int)pFVar25,
                            (ASN1_TYPE **)&pXStack_8d8);
      if (iVar2 != 0) {
        if (v_flag == 0) {
          return 1;
        }
        pcStack_8e8 = (code *)0x10d802;
        get_signed_attribute_cold_1();
        return 1;
      }
      pcStack_8e8 = (code *)0x10d764;
      __size = (char **)pXStack_8d8;
      uVar3 = ASN1_TYPE_get((ASN1_TYPE *)pXStack_8d8);
      if (uVar3 == extraout_EDX) {
        pcStack_8e8 = (code *)0x10d775;
        uVar3 = ASN1_STRING_length((ASN1_STRING *)pXStack_8d8->sig_alg);
        if ((int)uVar3 < 1) {
          return 1;
        }
        b = (char **)(ulong)uVar3;
        if (d_flag != 0) {
          pcStack_8e8 = (code *)0x10d7a3;
          pFVar25 = (FILE *)pname;
          printf("%s: allocating %d bytes for attribute\n",pname,b);
        }
        __size = (char **)(ulong)((extraout_EDX == 0x13) + uVar3);
        pcStack_8e8 = (code *)0x10d7b4;
        pcVar27 = (char *)malloc((size_t)__size);
        *buffer_00 = (EVP_PKEY *)pcVar27;
        if (pcVar27 != (char *)0x0) {
          pcStack_8e8 = (code *)0x10d7c8;
          __src = (void *)ASN1_STRING_get0_data(pXStack_8d8->sig_alg);
          pcStack_8e8 = (code *)0x10d7d9;
          memcpy(pcVar27,__src,(size_t)b);
          if (extraout_EDX != 0x13) {
            return 0;
          }
          (*buffer_00)[(long)b] = (EVP_PKEY)0x0;
          return 0;
        }
      }
      else {
        pcStack_8e8 = (code *)0x10d80c;
        get_signed_attribute_cold_2();
      }
      pcStack_8e8 = get_attribute;
      get_signed_attribute_cold_3();
      pcVar27 = pname;
      pXStack_8f8 = pXStack_8d8;
      pFVar11 = (FILE *)((ulong)pFVar25 & 0xffffffff);
      pFStack_908 = (FILE *)buffer_00;
      pFStack_900 = (FILE *)pcVar4;
      pFStack_8f0 = (FILE *)b;
      pcStack_8e8 = (code *)(ulong)extraout_EDX;
      if (d_flag != 0) {
        pFStack_910 = (FILE *)0x10d83e;
        pcVar15 = OBJ_nid2sn((int)pFVar25);
        pFStack_910 = (FILE *)0x10d852;
        printf("%s: finding attribute %s\n",pcVar27,pcVar15);
        b = (char **)pcVar27;
      }
      *(long *)extraout_RDX = 0;
      pFStack_910 = (FILE *)0x10d860;
      pFVar10 = pFVar11;
      pFVar12 = (FILE *)OBJ_nid2obj((int)pFVar25);
      if (pFVar12 != (FILE *)0x0) {
        pFStack_910 = (FILE *)0x10d870;
        iVar2 = OPENSSL_sk_num(__size);
        if (0 < iVar2) {
          pFVar11 = (FILE *)0x0;
          do {
            pFStack_910 = (FILE *)0x10d880;
            pcVar4 = (char *)OPENSSL_sk_value(__size,pFVar11);
            pFStack_910 = (FILE *)0x10d88b;
            a = X509_ATTRIBUTE_get0_object((X509_ATTRIBUTE *)pcVar4);
            pFStack_910 = (FILE *)0x10d896;
            iVar2 = OBJ_cmp(a,(ASN1_OBJECT *)pFVar12);
            if (iVar2 == 0) {
              pFStack_910 = (FILE *)0x10d8a2;
              pFVar10 = (FILE *)pcVar4;
              iVar2 = X509_ATTRIBUTE_count((X509_ATTRIBUTE *)pcVar4);
              if (iVar2 != 0) {
                if (*(long *)extraout_RDX != 0) {
                  pFStack_910 = (FILE *)0x10d8de;
                  get_attribute_cold_1();
                  b = (char **)pFVar12;
                  goto LAB_0010d8de;
                }
                pFStack_910 = (FILE *)0x10d8b6;
                pAVar16 = X509_ATTRIBUTE_get0_type((X509_ATTRIBUTE *)pcVar4,0);
                *(ASN1_TYPE **)extraout_RDX = pAVar16;
              }
            }
            uVar3 = (int)pFVar11 + 1;
            pFVar11 = (FILE *)(ulong)uVar3;
            pFStack_910 = (FILE *)0x10d8c3;
            iVar2 = OPENSSL_sk_num(__size);
          } while ((int)uVar3 < iVar2);
        }
        return (int)(*(long *)extraout_RDX == 0);
      }
LAB_0010d8de:
      pFStack_910 = (FILE *)0x10d8e3;
      get_attribute_cold_2();
      pFVar10 = *(FILE **)(*(long *)(pFVar10->__pad5 + 0x20) + 0x18);
      pFStack_928 = (FILE *)0x10d8ff;
      pXStack_918 = (X509_CRL *)__size;
      pFStack_910 = (FILE *)b;
      x = (X509_CRL *)OPENSSL_sk_value(pFVar10,0);
      if (x == (X509_CRL *)0x0) {
        pFStack_928 = (FILE *)0x10d9ac;
        write_crl_cold_3();
LAB_0010d9ac:
        pFStack_928 = (FILE *)0x10d9b1;
        write_crl_cold_2();
        pFVar12 = extraout_RDX;
      }
      else {
        b = &w_char;
        pFStack_928 = (FILE *)0x10d921;
        pFVar10 = (FILE *)w_char;
        pFVar12 = fopen(w_char,"w");
        __size = (char **)x;
        if (pFVar12 == (FILE *)0x0) goto LAB_0010d9ac;
        if (v_flag != 0) {
          pFStack_928 = (FILE *)0x10d951;
          printf("%s: writing CRL\n",pname);
        }
        if (d_flag != 0) {
          pFStack_928 = (FILE *)0x10d96f;
          PEM_write_X509_CRL(_stdout,x);
        }
        pFStack_928 = (FILE *)0x10d97a;
        pFVar10 = pFVar12;
        iVar2 = PEM_write_X509_CRL(pFVar12,x);
        if (iVar2 == 1) {
          pFStack_928 = (FILE *)0x10d99a;
          printf("%s: CRL written as %s\n",pname,w_char);
          iVar2 = fclose(pFVar12);
          return iVar2;
        }
      }
      pFStack_928 = (FILE *)write_local_cert;
      write_crl_cold_1();
      localcert = (X509 *)0x0;
      pFVar10 = *(FILE **)(*(long *)(pFVar10->__pad5 + 0x20) + 0x10);
      pFStack_950 = pFVar12;
      pFStack_948 = (FILE *)pcVar4;
      pFStack_940 = (FILE *)piVar28;
      pXStack_938 = (X509_CRL *)__size;
      pFStack_930 = (FILE *)b;
      pFStack_928 = pFVar11;
      if (v_flag != 0) {
        pFStack_1960 = (FILE *)0x10d9f7;
        uVar3 = OPENSSL_sk_num(pFVar10);
        pFStack_1960 = (FILE *)0x10da07;
        printf("write_local_cert(): found %d cert(s)\n",(ulong)uVar3);
      }
      pFStack_1960 = (FILE *)0x10da0f;
      pFVar12 = pFVar10;
      iVar2 = OPENSSL_sk_num();
      pXVar17 = (X509 *)localcert;
      if (0 < iVar2) {
        __size = (char **)0x0;
        do {
          pFStack_1960 = (FILE *)0x10da25;
          pXVar17 = (X509 *)OPENSSL_sk_value(pFVar10,__size);
          pcVar27 = pname;
          if (v_flag != 0) {
            pFStack_1960 = (FILE *)0x10da45;
            pXVar18 = X509_get_subject_name(pXVar17);
            pFStack_1960 = (FILE *)0x10da58;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10da6c;
            printf("%s: found certificate with\n  subject: \'%s\'\n",pcVar27,pcVar4);
            pFStack_1960 = (FILE *)0x10da74;
            pXVar18 = X509_get_issuer_name(pXVar17);
            pFStack_1960 = (FILE *)0x10da84;
            pcVar27 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10da95;
            printf("  issuer: %s\n",pcVar27);
            pFStack_1960 = (FILE *)0x10daa1;
            pXVar18 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFStack_1960 = (FILE *)0x10dab1;
            pcVar27 = X509_NAME_oneline(pXVar18,(char *)aFStack_1958,0x400);
            pFStack_1960 = (FILE *)0x10dac2;
            printf("  request_subject: \'%s\'\n",pcVar27);
            pFVar11 = aFStack_1958;
          }
          pFStack_1960 = (FILE *)0x10daca;
          pXVar18 = X509_get_subject_name(pXVar17);
          pFStack_1960 = (FILE *)0x10dad9;
          b_01 = (X509_NAME *)X509_REQ_get_subject_name(request);
          pFStack_1960 = (FILE *)0x10dae4;
          iVar2 = X509_NAME_cmp(pXVar18,b_01);
          if (d_flag != 0) {
            pFStack_1960 = (FILE *)0x10dbc5;
            write_local_cert_cold_1();
          }
          if (iVar2 == 0) {
LAB_0010db6a:
            if (v_flag != 0) {
              pFStack_1960 = (FILE *)0x10db7d;
              puts("CN\'s of request and certificate matched!");
            }
          }
          else {
            pFStack_1960 = (FILE *)0x10db04;
            pXVar18 = X509_get_subject_name(pXVar17);
            pFStack_1960 = (FILE *)0x10db1c;
            X509_NAME_oneline(pXVar18,acStack_1158,0x400);
            pFStack_1960 = (FILE *)0x10db28;
            pXVar18 = (X509_NAME *)X509_REQ_get_subject_name(request);
            pFVar11 = aFStack_1558;
            pFStack_1960 = (FILE *)0x10db40;
            X509_NAME_oneline(pXVar18,(char *)pFVar11,0x400);
            if (v_flag != 0) {
              pFStack_1960 = (FILE *)0x10db5b;
              printf(" X509_NAME_cmp() workaround: strcmp request subject (%s) to cert subject (%s)\n"
                     ,pFVar11,acStack_1158);
            }
            pFStack_1960 = (FILE *)0x10db66;
            iVar2 = strcmp(acStack_1158,(char *)pFVar11);
            if (iVar2 == 0) goto LAB_0010db6a;
            pFStack_1960 = (FILE *)0x10dbcf;
            write_local_cert_cold_2();
          }
          pFStack_1960 = (FILE *)0x10db85;
          b = (char **)X509_get_subject_name(pXVar17);
          pFStack_1960 = (FILE *)0x10db90;
          pXVar18 = X509_get_issuer_name(pXVar17);
          pFStack_1960 = (FILE *)0x10db9b;
          pFVar12 = (FILE *)b;
          iVar2 = X509_NAME_cmp((X509_NAME *)b,pXVar18);
          if (iVar2 != 0) break;
          uVar3 = (int)__size + 1;
          __size = (char **)(ulong)uVar3;
          pFStack_1960 = (FILE *)0x10dbaa;
          pFVar12 = pFVar10;
          iVar2 = OPENSSL_sk_num();
          pXVar17 = (X509 *)localcert;
        } while ((int)uVar3 < iVar2);
      }
      localcert = (X509 *)pXVar17;
      pXVar30 = localcert;
      if (localcert == (X509 *)0x0) {
        pFStack_1960 = (FILE *)0x10dc7f;
        write_local_cert_cold_5();
      }
      else {
        __size = &l_char;
        pFStack_1960 = (FILE *)0x10dc00;
        pFVar12 = (FILE *)l_char;
        pFVar19 = fopen(l_char,"w");
        if (pFVar19 != (FILE *)0x0) {
          if (v_flag != 0) {
            pFStack_1960 = (FILE *)0x10dc2a;
            printf("%s: certificate written as %s\n",pname,l_char);
          }
          if (d_flag != 0) {
            pFStack_1960 = (FILE *)0x10dc4c;
            PEM_write_X509(_stdout,(X509 *)localcert);
          }
          pFStack_1960 = (FILE *)0x10dc5b;
          pFVar12 = pFVar19;
          iVar2 = PEM_write_X509(pFVar19,(X509 *)localcert);
          pFVar10 = pFVar19;
          if (iVar2 == 1) {
            pFStack_1960 = (FILE *)0x10dc68;
            iVar2 = fclose(pFVar19);
            return iVar2;
          }
          goto LAB_0010dc84;
        }
      }
      pFStack_1960 = (FILE *)0x10dc84;
      write_local_cert_cold_4();
LAB_0010dc84:
      pFStack_1960 = (FILE *)write_other_cert;
      write_local_cert_cold_3();
      piStack_1980 = &v_flag;
      uVar24 = *(undefined8 *)(*(long *)(pFVar12->__pad5 + 0x20) + 0x10);
      pFStack_1d98 = (FILE *)0x10dcb4;
      pFStack_1988 = pFVar10;
      pXStack_1978 = pXVar30;
      pXStack_1970 = (X509_CRL *)__size;
      pFStack_1968 = (FILE *)b;
      pFStack_1960 = pFVar11;
      iVar2 = OPENSSL_sk_num(uVar24);
      piVar28 = &v_flag;
      if (0 < iVar2) {
        pXVar30 = (X509 *)0x0;
        do {
          pFStack_1d98 = (FILE *)0x10dccd;
          pFVar10 = (FILE *)OPENSSL_sk_value(uVar24,pXVar30);
          pcVar27 = pname;
          if (v_flag != 0) {
            pFStack_1d98 = (FILE *)0x10dcee;
            pXVar18 = X509_get_subject_name((X509 *)pFVar10);
            pFStack_1d98 = (FILE *)0x10dcfe;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)aiStack_1d90,0x400);
            pFStack_1d98 = (FILE *)0x10dd12;
            printf("%s: found certificate with\n  subject: %s\n",pcVar27,pcVar4);
            pFStack_1d98 = (FILE *)0x10dd1a;
            pXVar18 = X509_get_issuer_name((X509 *)pFVar10);
            pFStack_1d98 = (FILE *)0x10dd2a;
            pcVar4 = X509_NAME_oneline(pXVar18,(char *)aiStack_1d90,0x400);
            pFStack_1d98 = (FILE *)0x10dd3b;
            printf("  issuer: %s\n",pcVar4);
            pFVar11 = (FILE *)pcVar27;
          }
          pFStack_1d98 = (FILE *)0x10dd43;
          x_00 = X509_get_serialNumber((X509 *)pFVar10);
          pFStack_1d98 = (FILE *)0x10dd56;
          iVar2 = ASN1_INTEGER_cmp(x_00,*(ASN1_INTEGER **)((long)pFVar12->__pad3 + 8));
          piVar28 = aiStack_1d90;
          if (iVar2 == 0) goto LAB_0010dd73;
          uVar3 = (int)pXVar30 + 1;
          pXVar30 = (X509 *)(ulong)uVar3;
          pFStack_1d98 = (FILE *)0x10dd65;
          iVar2 = OPENSSL_sk_num(uVar24);
          piVar28 = aiStack_1d90;
        } while ((int)uVar3 < iVar2);
      }
      do {
        pFStack_1d98 = (FILE *)0x10dd73;
        write_other_cert_cold_3();
LAB_0010dd73:
      } while (pFVar10 == (FILE *)0x0);
      pFStack_1d98 = (FILE *)0x10dd8e;
      pFVar19 = (FILE *)w_char;
      pFVar25 = fopen(w_char,"w");
      if (pFVar25 == (FILE *)0x0) {
        pFStack_1d98 = (FILE *)0x10de0a;
        write_other_cert_cold_2();
      }
      else {
        if (v_flag != 0) {
          pFStack_1d98 = (FILE *)0x10ddbd;
          printf("%s: certificate written as %s\n",pname,w_char);
        }
        if (d_flag != 0) {
          pFStack_1d98 = (FILE *)0x10dddb;
          PEM_write_X509(_stdout,(X509 *)pFVar10);
        }
        pFStack_1d98 = (FILE *)0x10dde6;
        pFVar19 = pFVar25;
        iVar2 = PEM_write_X509(pFVar25,(X509 *)pFVar10);
        pFVar12 = pFVar25;
        if (iVar2 == 1) {
          pFStack_1d98 = (FILE *)0x10ddf3;
          iVar2 = fclose(pFVar25);
          return iVar2;
        }
      }
      pFStack_1d98 = (FILE *)write_ca_ra;
      write_other_cert_cold_1();
      ppcStack_1da0 = &w_char;
      pFStack_1dc0 = pFVar10;
      piStack_1db8 = piVar28;
      pXStack_1db0 = pXVar30;
      pFStack_1da8 = pFVar12;
      pFStack_1d98 = pFVar11;
      pBVar7 = BIO_new_mem_buf(pFVar19->_IO_read_end,*(int *)&pFVar19->_IO_read_base);
      pPVar8 = d2i_PKCS7_bio(pBVar7,(PKCS7 **)0x0);
      if (pPVar8 == (PKCS7 *)0x0) {
        pcVar27 = "%s: error reading PKCS#7 data\n";
LAB_0010de5c:
        fprintf(_stderr,pcVar27,pname);
LAB_0010de66:
        ERR_print_errors_fp(_stderr);
      }
      else {
        iVar2 = OBJ_obj2nid(pPVar8->type);
        if (iVar2 == 0x16) {
          lVar29 = ((pPVar8->d).data)->flags;
          if (lVar29 != 0) {
            pPStack_2620 = pPVar8;
            pBStack_2618 = pBVar7;
            iVar2 = OPENSSL_sk_num(lVar29);
            if (0 < iVar2) {
              uVar14 = 0;
              lStack_2610 = lVar29;
              do {
                memset(acStack_21c8,0,0x400);
                memset(acStack_25c8,0,0x400);
                pXVar17 = (X509 *)OPENSSL_sk_value(lVar29,uVar14);
                snprintf(acStack_25c8,0x400,"%s-%d",c_char,uVar14);
                pcVar27 = pname;
                if (v_flag != 0) {
                  pXVar18 = X509_get_subject_name(pXVar17);
                  pcVar4 = X509_NAME_oneline(pXVar18,acStack_21c8,0x400);
                  printf("\n%s: found certificate with\n  subject: %s\n",pcVar27,pcVar4);
                  if (v_flag != 0) {
                    pXVar18 = X509_get_issuer_name(pXVar17);
                    pcVar27 = X509_NAME_oneline(pXVar18,acStack_21c8,0x400);
                    printf("  issuer: %s\n",pcVar27);
                  }
                }
                iVar2 = X509_digest(pXVar17,(EVP_MD *)fp_alg,abStack_2608,&uStack_2624);
                if (iVar2 == 0) goto LAB_0010de66;
                iVar2 = X509_get_ext_by_NID(pXVar17,0x57,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  basic constraints: (not included)");
                  }
                }
                else {
                  pXVar20 = X509_get_ext(pXVar17,iVar2);
                  if (v_flag != 0) {
                    printf("  basic constraints: ");
                    X509V3_EXT_print_fp(_stdout,pXVar20,0,0);
                    putchar(10);
                  }
                }
                iVar2 = X509_get_ext_by_NID(pXVar17,0x53,-1);
                if (iVar2 < 0) {
                  if (v_flag != 0) {
                    puts("  usage: (not included)");
                    goto LAB_0010e0d7;
                  }
                }
                else {
                  pXVar20 = X509_get_ext(pXVar17,iVar2);
                  if (v_flag != 0) {
                    printf("  usage: ");
                    X509V3_EXT_print_fp(_stdout,pXVar20,0,0);
                    putchar(10);
LAB_0010e0d7:
                    if (v_flag != 0) {
                      iVar2 = EVP_MD_get_type(fp_alg);
                      pcVar27 = OBJ_nid2sn(iVar2);
                      printf("  %s fingerprint: ",pcVar27);
                      uVar23 = (ulong)uStack_2624;
                      if (0 < (int)uStack_2624) {
                        uVar21 = 0;
                        do {
                          uVar1 = uVar21 + 1;
                          uVar24 = 10;
                          if (uVar1 != (uVar23 & 0xffffffff)) {
                            uVar24 = 0x3a;
                          }
                          printf("%02X%c",(ulong)abStack_2608[uVar21],uVar24);
                          uVar23 = (ulong)(int)uStack_2624;
                          uVar21 = uVar1;
                        } while ((long)uVar1 < (long)uVar23);
                      }
                    }
                  }
                }
                pFVar11 = fopen(acStack_25c8,"w");
                if (pFVar11 == (FILE *)0x0) {
                  pcVar27 = "%s: cannot open cert file for writing\n";
                  goto LAB_0010dea6;
                }
                if (v_flag != 0) {
                  printf("%s: certificate written as %s\n",pname,acStack_25c8);
                }
                if (d_flag != 0) {
                  PEM_write_X509(_stdout,pXVar17);
                }
                iVar2 = PEM_write_X509(pFVar11,pXVar17);
                if (iVar2 != 1) {
                  pcVar27 = "%s: error while writing certificate file\n";
                  goto LAB_0010de5c;
                }
                fclose(pFVar11);
                lVar29 = lStack_2610;
                uVar3 = (int)uVar14 + 1;
                uVar14 = (ulong)uVar3;
                iVar2 = OPENSSL_sk_num(lStack_2610);
              } while ((int)uVar3 < iVar2);
            }
            PKCS7_free(pPStack_2620);
            BIO_free(pBStack_2618);
            exit(0);
          }
          pcVar27 = "%s: cannot find certificates\n";
LAB_0010dea6:
          fprintf(_stderr,pcVar27,pname);
        }
        else {
          printf("%s: wrong PKCS#7 type\n",pname);
        }
      }
      exit(0x5d);
    }
  }
  pFStack_468 = (FILE *)0x10cf79;
  pkcs7_verify_unwrap_cold_9();
LAB_0010cf79:
  pFStack_468 = (FILE *)0x10cf91;
  printf("%s: error verifying signature Error \n",pname);
  pFStack_468 = (FILE *)0x10cfa0;
  ERR_print_errors_fp(_stderr);
  pFStack_468 = (FILE *)0x10cfaa;
  exit(0x61);
}

Assistant:

int add_attribute_octet(STACK_OF(X509_ATTRIBUTE) *attrs, int nid, unsigned char *buffer,
		int len) {
	ASN1_STRING     *asn1_string = NULL;
	X509_ATTRIBUTE  *x509_a;
	int		c;

	if (d_flag)
		printf("%s: adding octet attribute %s\n", pname,
			OBJ_nid2sn(nid));

	asn1_string = ASN1_STRING_new();
	if ((c = ASN1_STRING_set(asn1_string, buffer, len)) <= 0) {
		fprintf(stderr, "%s: error adding data to ASN.1 string\n",
			pname);
		ERR_print_errors_fp(stderr);
		exit (SCEP_PKISTATUS_P7);
	}
	x509_a = X509_ATTRIBUTE_create(nid, V_ASN1_OCTET_STRING,
		asn1_string);
	sk_X509_ATTRIBUTE_push(attrs, x509_a);
	return (0);

}